

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

string * vkt::tessellation::anon_unknown_1::glslTraverseBasicTypes
                   (string *__return_storage_ptr__,string *rootName,VarType *rootType,
                   int arrayNestingDepth,int indentationDepth,BasicTypeVisitFunc visit)

{
  Type TVar1;
  int iVar2;
  StructType *pSVar3;
  pointer pSVar4;
  pointer pcVar5;
  string *psVar6;
  long *plVar7;
  string *extraout_RAX;
  undefined8 *puVar8;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  string loopIndexName;
  string indentation;
  string arrayLength;
  string *local_448;
  long local_440;
  undefined1 local_438 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  string *local_408;
  BasicTypeVisitFunc local_400;
  string *local_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0;
  long lStack_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined8 uStack_3b8;
  long *local_3b0;
  undefined8 local_3a8;
  long local_3a0;
  undefined8 uStack_398;
  long *local_390 [2];
  long local_380 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  ulong *local_328;
  long local_320;
  ulong local_318;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  string local_228;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  TVar1 = rootType->m_type;
  local_408 = __return_storage_ptr__;
  local_400 = visit;
  local_3f8 = rootName;
  if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (rootType->m_data).structPtr;
    uVar14 = (int)((long)(pSVar3->m_members).
                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pSVar3->m_members).
                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    local_370 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_370;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((int)uVar14 < 1) {
      return (string *)local_370;
    }
    uVar15 = (ulong)(uVar14 & 0x7fffffff);
    lVar16 = 0x20;
    do {
      pSVar4 = (pSVar3->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_448 = (string *)local_438;
      pcVar5 = (local_3f8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_448,pcVar5,pcVar5 + local_3f8->_M_string_length);
      std::__cxx11::string::append((char *)&local_448);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar9) {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_418._8_8_ = plVar7[3];
        local_438._16_8_ = &local_418;
      }
      else {
        local_418._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_438._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_438._24_8_ = plVar7[1];
      *plVar7 = (long)paVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      glslTraverseBasicTypes
                (local_1a8,(string *)(local_438 + 0x10),
                 (VarType *)((long)&(pSVar4->m_name)._M_dataplus._M_p + lVar16),arrayNestingDepth,
                 indentationDepth,local_400);
      std::__cxx11::string::_M_append((char *)local_408,(ulong)local_1a8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._16_8_ != &local_418) {
        operator_delete((void *)local_438._16_8_,local_418._M_allocated_capacity + 1);
      }
      psVar6 = (string *)local_438;
      if (local_448 != psVar6) {
        operator_delete(local_448,(ulong)(local_438._0_8_ + 1));
        psVar6 = extraout_RAX;
      }
      lVar16 = lVar16 + 0x38;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    return psVar6;
  }
  if (TVar1 != TYPE_ARRAY) {
    if (TVar1 == TYPE_BASIC) {
      psVar6 = (*visit)(__return_storage_ptr__,rootName,(rootType->m_data).basic.type,
                        indentationDepth);
      return psVar6;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_438._16_8_ = &local_418;
  std::__cxx11::string::_M_construct((ulong)(local_438 + 0x10),(char)indentationDepth);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,arrayNestingDepth);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_390,0,(char *)0x0,0xb9cce2);
  local_448 = (string *)local_438;
  psVar6 = (string *)(plVar7 + 2);
  if ((string *)*plVar7 == psVar6) {
    local_438._0_8_ = (psVar6->_M_dataplus)._M_p;
    local_438._8_8_ = plVar7[3];
  }
  else {
    local_438._0_8_ = (psVar6->_M_dataplus)._M_p;
    local_448 = (string *)*plVar7;
  }
  local_440 = plVar7[1];
  *plVar7 = (long)psVar6;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  iVar2 = (rootType->m_data).array.size;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_438._16_8_,local_438._24_8_ + local_438._16_8_);
  std::__cxx11::string::append((char *)local_348);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_348,(ulong)local_448);
  local_2e8 = &local_2d8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_2d8 = *plVar10;
    lStack_2d0 = plVar7[3];
  }
  else {
    local_2d8 = *plVar10;
    local_2e8 = (long *)*plVar7;
  }
  local_2e0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_2c8 = &local_2b8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_2b8 = *plVar10;
    lStack_2b0 = plVar7[3];
  }
  else {
    local_2b8 = *plVar10;
    local_2c8 = (long *)*plVar7;
  }
  local_2c0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_448);
  local_2a8 = &local_298;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_298 = *plVar10;
    lStack_290 = plVar7[3];
  }
  else {
    local_298 = *plVar10;
    local_2a8 = (long *)*plVar7;
  }
  local_2a0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_3e0 = *puVar11;
    lStack_3d8 = plVar7[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *puVar11;
    local_3f0 = (ulong *)*plVar7;
  }
  local_3e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  iVar2 = (rootType->m_data).array.size;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar15 = 0xf;
  if (local_3f0 != &local_3e0) {
    uVar15 = local_3e0;
  }
  if (uVar15 < (ulong)(local_300 + local_3e8)) {
    uVar15 = 0xf;
    if (local_308 != local_2f8) {
      uVar15 = local_2f8[0];
    }
    if (uVar15 < (ulong)(local_300 + local_3e8)) goto LAB_007ac155;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_3f0);
  }
  else {
LAB_007ac155:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f0,(ulong)local_308);
  }
  local_3d0 = &local_3c0;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_3c0 = *plVar7;
    uStack_3b8 = puVar8[3];
  }
  else {
    local_3c0 = *plVar7;
    local_3d0 = (long *)*puVar8;
  }
  local_3c8 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_1f8 = *plVar10;
    lStack_1f0 = plVar7[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar10;
    local_208 = (long *)*plVar7;
  }
  local_200 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_448);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_1d8 = *plVar10;
    lStack_1d0 = plVar7[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar10;
    local_1e8 = (long *)*plVar7;
  }
  local_1e0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_288 = &local_278;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_278 = *plVar10;
    lStack_270 = plVar7[3];
  }
  else {
    local_278 = *plVar10;
    local_288 = (long *)*plVar7;
  }
  local_280 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_288,local_438._16_8_);
  local_268 = &local_258;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_258 = *plVar10;
    lStack_250 = plVar7[3];
  }
  else {
    local_258 = *plVar10;
    local_268 = (long *)*plVar7;
  }
  local_260 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_318 = *puVar11;
    uStack_310 = (undefined4)plVar7[3];
    uStack_30c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_328 = &local_318;
  }
  else {
    local_318 = *puVar11;
    local_328 = (ulong *)*plVar7;
  }
  local_320 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_368[0] = local_358;
  pcVar5 = (local_3f8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,pcVar5,pcVar5 + local_3f8->_M_string_length);
  std::__cxx11::string::append((char *)local_368);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_368,(ulong)local_448);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_238 = *plVar10;
    lStack_230 = plVar7[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar10;
    local_248 = (long *)*plVar7;
  }
  local_240 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_228.field_2._M_allocated_capacity = *psVar12;
    local_228.field_2._8_8_ = plVar7[3];
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar12;
    local_228._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_228._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  glslTraverseBasicTypes
            (local_1a8,&local_228,(rootType->m_data).array.elementType,arrayNestingDepth + 1,
             indentationDepth + 1,local_400);
  uVar15 = 0xf;
  if (local_328 != &local_318) {
    uVar15 = local_318;
  }
  if (uVar15 < local_1a8[0]._M_string_length + local_320) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      uVar13 = local_1a8[0].field_2._M_allocated_capacity;
    }
    if (local_1a8[0]._M_string_length + local_320 <= (ulong)uVar13) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)local_328);
      goto LAB_007ac560;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_1a8[0]._M_dataplus._M_p);
LAB_007ac560:
  local_3b0 = &local_3a0;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_3a0 = *plVar7;
    uStack_398 = puVar8[3];
  }
  else {
    local_3a0 = *plVar7;
    local_3b0 = (long *)*puVar8;
  }
  local_3a8 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_3b0,local_438._16_8_);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_1b8 = *plVar10;
    lStack_1b0 = plVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar10;
    local_1c8 = (long *)*plVar7;
  }
  local_1c0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  (local_408->_M_dataplus)._M_p = (pointer)&local_408->field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    lVar16 = plVar7[3];
    (local_408->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&local_408->field_2 + 8) = lVar16;
  }
  else {
    (local_408->_M_dataplus)._M_p = (pointer)*plVar7;
    (local_408->field_2)._M_allocated_capacity = *psVar12;
  }
  local_408->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0 + 1);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  psVar6 = (string *)local_438;
  if (local_448 != psVar6) {
    operator_delete(local_448,(ulong)(local_438._0_8_ + 1));
    psVar6 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._16_8_ != &local_418) {
    operator_delete((void *)local_438._16_8_,local_418._M_allocated_capacity + 1);
    psVar6 = extraout_RAX_01;
  }
  return psVar6;
}

Assistant:

std::string glslTraverseBasicTypes (const std::string&			rootName,
									const glu::VarType&			rootType,
									const int					arrayNestingDepth,
									const int					indentationDepth,
									const BasicTypeVisitFunc	visit)
{
	if (rootType.isBasicType())
		return visit(rootName, rootType.getBasicType(), indentationDepth);
	else if (rootType.isArrayType())
	{
		const std::string indentation	= std::string(indentationDepth, '\t');
		const std::string loopIndexName	= "i" + de::toString(arrayNestingDepth);
		const std::string arrayLength	= de::toString(rootType.getArraySize());
		return indentation + "for (int " + loopIndexName + " = 0; " + loopIndexName + " < " + de::toString(rootType.getArraySize()) + "; ++" + loopIndexName + ")\n" +
			   indentation + "{\n" +
			   glslTraverseBasicTypes(rootName + "[" + loopIndexName + "]", rootType.getElementType(), arrayNestingDepth+1, indentationDepth+1, visit) +
			   indentation + "}\n";
	}
	else if (rootType.isStructType())
	{
		const glu::StructType&	structType = *rootType.getStructPtr();
		const int				numMembers = structType.getNumMembers();
		std::string				result;

		for (int membNdx = 0; membNdx < numMembers; ++membNdx)
		{
			const glu::StructMember& member = structType.getMember(membNdx);
			result += glslTraverseBasicTypes(rootName + "." + member.getName(), member.getType(), arrayNestingDepth, indentationDepth, visit);
		}

		return result;
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}